

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString __thiscall SimpleString::lowerCase(SimpleString *this)

{
  char cVar1;
  size_t sVar2;
  SimpleString *in_RDI;
  size_t i;
  size_t str_size;
  SimpleString *str;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  SimpleString *pSVar3;
  ulong local_38;
  
  pSVar3 = in_RDI;
  SimpleString(in_RDI,(SimpleString *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8))
  ;
  sVar2 = size((SimpleString *)0x20a8c4);
  for (local_38 = 0; local_38 < sVar2; local_38 = local_38 + 1) {
    cVar1 = ToLower('\0');
    in_RDI->buffer_[local_38] = cVar1;
  }
  return (SimpleString)(char *)pSVar3;
}

Assistant:

SimpleString SimpleString::lowerCase() const
{
    SimpleString str(*this);

    size_t str_size = str.size();
    for (size_t i = 0; i < str_size; i++)
        str.buffer_[i] = ToLower(str.buffer_[i]);

    return str;
}